

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qasn1element.cpp
# Opt level: O1

QAsn1Element * __thiscall QAsn1Element::toDateTime(QAsn1Element *this)

{
  storage_type *psVar1;
  Data DVar2;
  char cVar3;
  undefined4 uVar4;
  long lVar5;
  char *in_RSI;
  long in_FS_OFFSET;
  QByteArrayView QVar6;
  QByteArrayView QVar7;
  QByteArrayView QVar8;
  QStringView QVar9;
  QStringView QVar10;
  QStringView QVar11;
  QTime time;
  Data local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  Data local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined1 **)this = &DAT_aaaaaaaaaaaaaaaa;
  QDateTime::QDateTime((QDateTime *)this);
  psVar1 = *(storage_type **)(in_RSI + 0x18);
  if (((((ulong)psVar1 | 2) == 0xf) && ((int)**(char **)(in_RSI + 0x10) - 0x30U < 10)) &&
     ((*(char **)(in_RSI + 0x10) + -1)[(long)psVar1] == 'Z')) {
    if (*in_RSI == '\x17' && psVar1 == (storage_type *)0xd) {
      QVar7.m_data = (storage_type *)0x6;
      QVar7.m_size = (qsizetype)&local_48;
      QString::fromLatin1(QVar7);
      local_68.d = local_48.d;
      uStack_60 = uStack_40;
      local_58 = local_38;
      QVar10.m_data = L"yyMMdd";
      QVar10.m_size = 6;
      lVar5 = QDate::fromString((QString *)&local_68.s,QVar10,0x79e);
      if ((QArrayData *)local_68.d != (QArrayData *)0x0) {
        LOCK();
        *(int *)local_68.d = *(int *)local_68.d + -1;
        UNLOCK();
        if (*(int *)local_68.d == 0) {
          QArrayData::deallocate((QArrayData *)local_68.d,2,0x10);
        }
      }
      if (lVar5 + 0xb69eeff91fU < 0x16d3e147974) {
        QVar8.m_data = (storage_type *)0x6;
        QVar8.m_size = (qsizetype)&local_48;
        QString::fromLatin1(QVar8);
        local_68 = local_48;
        uStack_60 = uStack_40;
        local_58 = local_38;
        QVar11.m_data = L"HHmmss";
        QVar11.m_size = 6;
        uVar4 = QTime::fromString((QString *)&local_68.s,QVar11);
        if ((QArrayData *)local_68.d != (QArrayData *)0x0) {
          LOCK();
          *(int *)local_68.d = *(int *)local_68.d + -1;
          UNLOCK();
          if (*(int *)local_68.d == 0) {
            QArrayData::deallocate((QArrayData *)local_68.d,2,0x10);
          }
        }
        cVar3 = QTime::isValid();
        if (cVar3 != '\0') {
          local_68 = (Data)0x2;
          QDateTime::QDateTime((QDateTime *)&local_48,lVar5,uVar4,&local_68,1);
          DVar2.s = *(ShortData *)this;
          *(Data *)this = local_48;
          local_48.s = DVar2.s;
          QDateTime::~QDateTime((QDateTime *)&local_48.s);
          QTimeZone::~QTimeZone((QTimeZone *)&local_68.s);
        }
      }
    }
    else if (psVar1 == (storage_type *)0xf && *in_RSI == '\x18') {
      QVar6.m_data = psVar1;
      QVar6.m_size = (qsizetype)&local_48;
      QString::fromLatin1(QVar6);
      QVar9.m_data = (storage_type_conflict *)0xf;
      QVar9.m_size = (qsizetype)&local_48;
      QDateTime::fromString((QString *)&local_68.s,QVar9,0x13c1fc);
      DVar2.s = *(ShortData *)this;
      *(Data *)this = local_68;
      local_68.s = DVar2.s;
      QDateTime::~QDateTime((QDateTime *)&local_68.s);
      if ((QArrayData *)local_48.d != (QArrayData *)0x0) {
        LOCK();
        *(int *)local_48.d = *(int *)local_48.d + -1;
        UNLOCK();
        if (*(int *)local_48.d == 0) {
          QArrayData::deallocate((QArrayData *)local_48.d,2,0x10);
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return this;
  }
  __stack_chk_fail();
}

Assistant:

QDateTime QAsn1Element::toDateTime() const
{
    QDateTime result;

    if (mValue.size() != 13 && mValue.size() != 15)
        return result;

    // QDateTime::fromString is lenient and accepts +- signs in front
    // of the year; but ASN.1 doesn't allow them.
    if (!isAsciiDigit(mValue[0]))
        return result;

    // Timezone must be present, and UTC
    if (mValue.back() != 'Z')
        return result;

    if (mType == UtcTimeType && mValue.size() == 13) {
        // RFC 2459:
        //   Where YY is greater than or equal to 50, the year shall be
        //   interpreted as 19YY; and
        //
        //   Where YY is less than 50, the year shall be interpreted as 20YY.
        //
        // so use 1950 as base year.
        constexpr int rfc2459CenturyStart = 1950;
        const QLatin1StringView inputView(mValue);
        QDate date = QDate::fromString(inputView.first(6), u"yyMMdd", rfc2459CenturyStart);
        if (!date.isValid())
            return result;

        Q_ASSERT(date.year() >= rfc2459CenturyStart);
        Q_ASSERT(date.year() < 100 + rfc2459CenturyStart);

        QTime time = QTime::fromString(inputView.sliced(6, 6), u"HHmmss");
        if (!time.isValid())
            return result;
        result = QDateTime(date, time, QTimeZone::UTC);
    } else if (mType == GeneralizedTimeType && mValue.size() == 15) {
        result = QDateTime::fromString(QString::fromLatin1(mValue), u"yyyyMMddHHmmsst");
    }

    return result;
}